

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O1

void Theta(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  long lVar1;
  ulong *puVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  pointer pvVar6;
  undefined1 auVar7 [16];
  pointer pvVar8;
  ulong uVar9;
  int x;
  long lVar10;
  long lVar11;
  pointer puVar12;
  long lVar13;
  
  pvVar8 = (A->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (C->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar10 = 0;
  do {
    puVar2 = (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar12[lVar10] = puVar2[1] ^ *puVar2 ^ puVar2[2] ^ puVar2[3] ^ puVar2[4];
    lVar10 = lVar10 + 1;
    pvVar8 = pvVar8 + 1;
  } while (lVar10 != 5);
  puVar3 = (C->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (D->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar12 = puVar3 + 4;
  uVar9 = 4;
  lVar10 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar9;
    lVar1 = lVar10 + 1;
    lVar13 = 0;
    if (lVar10 != 4) {
      lVar13 = lVar1;
    }
    uVar5 = puVar3[lVar13];
    puVar4[lVar10] =
         (uVar5 << 1 | (ulong)((long)uVar5 < 0)) ^
         *(ulong *)((long)puVar12 +
                   (SUB168(auVar7 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8U) * -5);
    puVar12 = puVar12 + 1;
    uVar9 = uVar9 + 1;
    lVar10 = lVar1;
  } while (lVar1 != 5);
  pvVar8 = (A->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (D->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar6 = (B->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = 0;
  do {
    lVar1 = *(long *)&pvVar8[lVar10].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    lVar13 = *(long *)&pvVar6[lVar10].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    lVar11 = 0;
    do {
      *(unsigned_long *)(lVar13 + lVar11 * 8) = puVar12[lVar10] ^ *(ulong *)(lVar1 + lVar11 * 8);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 5);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  return;
}

Assistant:

void Theta(Sarray &A, Sarray &B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int x=0;x<5;x++){
        C[x] = A[x][0]^A[x][1]^A[x][2]^A[x][3]^A[x][4];
    }

    for(int x=0;x<5;x++){
        D[x] = (C[(x+4)%5])^(rot(C[(x+1)%5],1));
    }

    for(int x=0;x<5;x++){
        for(int y=0;y<5;y++){
            B[x][y] = A[x][y] ^ D[x];
        }
    }
}